

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  int cy;
  uchar *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int cx;
  ushort uVar9;
  undefined8 __ptr;
  int iVar10;
  int iVar11;
  uint uVar12;
  int num_vertices;
  int iVar13;
  ulong uVar14;
  stbtt_vertex *vertices;
  ushort *puVar15;
  stbtt_vertex *psVar16;
  long lVar17;
  short sVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  stbtt_int32 sVar22;
  uint uVar23;
  byte bVar24;
  short sVar25;
  int sx;
  byte bVar26;
  ushort uVar27;
  long lVar28;
  uint uVar29;
  ulong uVar31;
  ushort *puVar32;
  int iVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar40;
  float fVar41;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar42;
  float fVar43;
  ulong local_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  stbtt__csctx local_a8;
  stbtt__csctx count_ctx;
  ulong uVar30;
  
  if ((info->cff).size == 0) {
    puVar4 = info->data;
    uVar12 = stbtt__GetGlyfOffset(info,glyph_index);
    *pvertices = (stbtt_vertex *)0x0;
    iVar10 = 0;
    if (-1 < (int)uVar12) {
      uVar14 = (ulong)uVar12;
      uVar9 = CONCAT11(puVar4[uVar14],puVar4[uVar14 + 1]);
      if ((short)uVar9 < 1) {
        if ((short)((ushort)puVar4[uVar14] << 8) < 0) {
          uVar20 = 0;
          vertices = (stbtt_vertex *)0x0;
          puVar15 = (ushort *)(puVar4 + uVar14 + 10);
          for (bVar24 = 1; bVar24 != 0; bVar24 = bVar24 & 0x20) {
            count_ctx.bounds = 0;
            count_ctx.started = 0;
            bVar24 = *(byte *)((long)puVar15 + 1);
            if ((bVar24 & 2) == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/stb_truetype.h"
                            ,0x72e,
                            "int stbtt__GetGlyphShapeTT(const stbtt_fontinfo *, int, stbtt_vertex **)"
                           );
            }
            if ((bVar24 & 1) == 0) {
              iVar10 = (int)(char)puVar15[2];
              iVar11 = (int)((long)((ulong)*(byte *)((long)puVar15 + 5) << 0x38) >> 0x38);
              lVar17 = 6;
            }
            else {
              auVar6._9_7_ = 0;
              auVar6._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
              auVar5._10_6_ = 0;
              auVar5._0_10_ = SUB1610(auVar6 << 0x38,6);
              auVar39._11_5_ = 0;
              auVar39._0_11_ = SUB1611(auVar5 << 0x30,5);
              auVar7._1_12_ = SUB1612(auVar39 << 0x28,4);
              auVar7[0] = (char)puVar15[3];
              auVar7._13_3_ = 0;
              auVar35._1_14_ = SUB1614(auVar7 << 0x18,2);
              auVar35[0] = (char)puVar15[2];
              auVar35[0xf] = 0;
              auVar35 = ZEXT416((uint)*(byte *)((long)puVar15 + 7) << 0x10 |
                                (uint)*(byte *)((long)puVar15 + 5)) | auVar35 << 8;
              iVar10 = (int)auVar35._0_2_;
              iVar11 = (int)auVar35._2_2_;
              lVar17 = 8;
            }
            puVar32 = (ushort *)(lVar17 + (long)puVar15);
            if ((bVar24 & 8) == 0) {
              if ((bVar24 & 0x40) != 0) {
                uVar9 = *puVar32;
                fVar37 = (float)(int)(short)(puVar32[1] << 8 | puVar32[1] >> 8) * 6.1035156e-05;
                puVar32 = puVar32 + 2;
                _local_c8 = ZEXT416((uint)((float)(int)(short)(uVar9 << 8 | uVar9 >> 8) *
                                          6.1035156e-05));
                goto LAB_00132bfd;
              }
              if ((char)bVar24 < '\0') {
                local_c8._0_4_ =
                     (float)(int)CONCAT11((char)*puVar32,*(undefined1 *)((long)puVar32 + 1)) *
                     6.1035156e-05;
                local_c8._4_4_ =
                     (float)(int)((long)((ulong)CONCAT11((char)puVar32[2],
                                                         *(undefined1 *)((long)puVar32 + 5)) << 0x30
                                        ) >> 0x30) * 6.1035156e-05;
                register0x00001288 = 0;
                local_f8._0_4_ =
                     (float)(int)CONCAT11((char)puVar32[1],*(undefined1 *)((long)puVar32 + 3)) *
                     6.1035156e-05;
                local_f8._4_4_ =
                     (float)(int)((long)((ulong)CONCAT11((char)puVar32[3],
                                                         *(undefined1 *)((long)puVar32 + 7)) << 0x30
                                        ) >> 0x30) * 6.1035156e-05;
                local_f8._8_8_ = 0;
                puVar32 = puVar32 + 4;
              }
              else {
                _local_c8 = ZEXT812(0x3f800000);
                fStack_bc = 0.0;
                local_f8 = ZEXT816(0x3f80000000000000);
              }
            }
            else {
              fVar37 = (float)(int)(short)(*puVar32 << 8 | *puVar32 >> 8) * 6.1035156e-05;
              puVar32 = puVar32 + 1;
              register0x00001244 = SUB1612((undefined1  [16])0x0,4);
              local_c8._0_4_ = fVar37;
LAB_00132bfd:
              local_f8 = ZEXT416((uint)fVar37) << 0x20;
            }
            uVar23 = stbtt_GetGlyphShape(info,(uint)(ushort)(puVar15[1] << 8 | puVar15[1] >> 8),
                                         (stbtt_vertex **)&count_ctx);
            __ptr = count_ctx._0_8_;
            uVar12 = (uint)uVar20;
            if (0 < (int)uVar23) {
              fVar37 = local_f8._0_4_;
              fVar40 = local_f8._4_4_;
              auVar34._0_4_ = fVar37 * fVar37;
              auVar34._4_4_ = fVar40 * fVar40;
              auVar34._8_4_ = local_f8._8_4_ * local_f8._8_4_;
              auVar34._12_4_ = local_f8._12_4_ * local_f8._12_4_;
              auVar36._0_4_ = (float)local_c8._0_4_ * (float)local_c8._0_4_ + auVar34._0_4_;
              auVar36._4_4_ = (float)local_c8._4_4_ * (float)local_c8._4_4_ + auVar34._4_4_;
              auVar36._8_4_ = fStack_c0 * fStack_c0 + auVar34._8_4_;
              auVar36._12_4_ = fStack_bc * fStack_bc + auVar34._12_4_;
              auVar35 = sqrtps(auVar34,auVar36);
              for (lVar17 = 0; (ulong)uVar23 * 0xe - lVar17 != 0; lVar17 = lVar17 + 0xe) {
                fVar41 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 4 + lVar17) <<
                                            0x30) >> 0x30);
                fVar42 = (float)(int)*(short *)(count_ctx._0_8_ + 2 + lVar17);
                fVar43 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 6 + lVar17) <<
                                            0x30) >> 0x30);
                auVar38._0_4_ =
                     (int)((fVar42 * (float)local_c8._4_4_ +
                            (float)(int)*(short *)(count_ctx._0_8_ + lVar17) * (float)local_c8._0_4_
                           + (float)iVar10) * auVar35._0_4_);
                auVar38._4_4_ =
                     (int)((fVar42 * fVar40 +
                            (float)(int)*(short *)(count_ctx._0_8_ + lVar17) * fVar37 +
                           (float)iVar11) * auVar35._4_4_);
                auVar38._8_4_ =
                     (int)((fVar43 * (float)local_c8._4_4_ + fVar41 * (float)local_c8._0_4_ +
                           (float)iVar10) * auVar35._0_4_);
                auVar38._12_4_ =
                     (int)((fVar43 * fVar40 + fVar41 * fVar37 + (float)iVar11) * auVar35._4_4_);
                auVar39 = packssdw(auVar38,auVar38);
                *(long *)(count_ctx._0_8_ + lVar17) = auVar39._0_8_;
              }
              psVar16 = (stbtt_vertex *)malloc((ulong)(uVar23 + uVar12) * 0xe);
              if (psVar16 == (stbtt_vertex *)0x0) {
                free(vertices);
                free((void *)__ptr);
                goto LAB_00132695;
              }
              if ((0 < (int)uVar12) && (vertices != (stbtt_vertex *)0x0)) {
                memcpy(psVar16,vertices,uVar20 * 0xe);
              }
              memcpy(psVar16 + uVar20,(void *)__ptr,(ulong)uVar23 * 0xe);
              free(vertices);
              free((void *)__ptr);
              vertices = psVar16;
              uVar12 = uVar23 + uVar12;
            }
            uVar20 = (ulong)uVar12;
            puVar15 = puVar32;
          }
        }
        else {
          uVar20 = 0;
          vertices = (stbtt_vertex *)0x0;
        }
      }
      else {
        uVar12 = (uint)uVar9 * 2;
        uVar20 = (ulong)uVar12;
        bVar24 = puVar4[uVar20 + uVar14 + 10];
        bVar26 = puVar4[uVar20 + uVar14 + 0xb];
        bVar1 = puVar4[uVar20 + uVar14 + 8];
        bVar2 = puVar4[uVar20 + uVar14 + 9];
        iVar10 = (uint)bVar1 * 0x100 + (uint)bVar2;
        vertices = (stbtt_vertex *)malloc((ulong)((iVar10 + (uint)uVar9 * 2) * 0xe + 0xe));
        if (vertices == (stbtt_vertex *)0x0) {
          return 0;
        }
        puVar15 = (ushort *)(puVar4 + (ulong)bVar24 * 0x100 + (ulong)bVar26 + uVar20 + uVar14 + 0xc)
        ;
        uVar20 = uVar20 & 0xffff;
        lVar17 = (ulong)(CONCAT11(bVar1,bVar2) + 1) * 0xe;
        bVar26 = 0;
        bVar24 = 0;
        for (lVar28 = 0; lVar17 - lVar28 != 0; lVar28 = lVar28 + 0xe) {
          if (bVar26 == 0) {
            bVar24 = (byte)*puVar15;
            if ((bVar24 & 8) == 0) {
              puVar15 = (ushort *)((long)puVar15 + 1);
              bVar26 = 0;
            }
            else {
              bVar26 = *(byte *)((long)puVar15 + 1);
              puVar15 = puVar15 + 1;
            }
          }
          else {
            bVar26 = bVar26 - 1;
          }
          (&vertices[uVar20].type)[lVar28] = bVar24;
        }
        sVar25 = 0;
        for (lVar28 = 0; lVar17 - lVar28 != 0; lVar28 = lVar28 + 0xe) {
          bVar24 = (&vertices[uVar20].type)[lVar28];
          if ((bVar24 & 2) == 0) {
            if ((bVar24 & 0x10) == 0) {
              sVar25 = sVar25 + (*puVar15 << 8 | *puVar15 >> 8);
              puVar15 = puVar15 + 1;
            }
          }
          else {
            uVar27 = *puVar15;
            puVar15 = (ushort *)((long)puVar15 + 1);
            uVar9 = -(ushort)(byte)uVar27;
            if ((bVar24 & 0x10) != 0) {
              uVar9 = (ushort)(byte)uVar27;
            }
            sVar25 = sVar25 + uVar9;
          }
          *(short *)((long)&vertices[uVar20].x + lVar28) = sVar25;
        }
        sVar25 = 0;
        for (lVar28 = 0; lVar17 - lVar28 != 0; lVar28 = lVar28 + 0xe) {
          bVar24 = (&vertices[uVar20].type)[lVar28];
          if ((bVar24 & 4) == 0) {
            if ((bVar24 & 0x20) == 0) {
              sVar25 = sVar25 + (*puVar15 << 8 | *puVar15 >> 8);
              puVar15 = puVar15 + 1;
            }
          }
          else {
            uVar9 = *puVar15;
            puVar15 = (ushort *)((long)puVar15 + 1);
            uVar27 = -(ushort)(byte)uVar9;
            if ((bVar24 & 0x20) != 0) {
              uVar27 = (ushort)(byte)uVar9;
            }
            sVar25 = sVar25 + uVar27;
          }
          *(short *)((long)&vertices[uVar20].y + lVar28) = sVar25;
        }
        iVar11 = 0;
        uVar23 = 0;
        local_108 = 0;
        sx = 0;
        uVar20 = 0;
        sVar22 = 0;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_e8._0_8_;
        local_e8 = auVar8 << 0x40;
        iVar33 = 0;
        iVar19 = 0;
        iVar13 = 0;
        num_vertices = 0;
        cx = 0;
        while( true ) {
          cy = (int)local_108;
          if (iVar10 < iVar13) break;
          lVar17 = (long)(int)(iVar13 + uVar12);
          bVar24 = vertices[lVar17].type;
          sVar25 = vertices[lVar17].x;
          sVar3 = vertices[lVar17].y;
          iVar21 = (int)sVar25;
          uVar29 = (uint)sVar3;
          uVar30 = (ulong)uVar29;
          if (iVar33 == iVar13) {
            if (iVar33 != 0) {
              num_vertices = stbtt__close_shape(vertices,num_vertices,iVar11,uVar23,sx,
                                                (stbtt_int32)uVar20,sVar22,local_e8._0_4_,cx,cy);
            }
            uVar20 = uVar30;
            uVar31 = local_e8._0_8_;
            iVar13 = iVar33;
            sx = iVar21;
            if ((bVar24 & 1) == 0) {
              uVar31 = uVar30;
              sVar22 = iVar21;
              if ((vertices[lVar17 + 1].type & 1) == 0) {
                uVar20 = (ulong)(uint)((int)((int)vertices[lVar17 + 1].y + uVar29) >> 1);
                sx = vertices[lVar17 + 1].x + iVar21 >> 1;
              }
              else {
                uVar20 = (ulong)(uint)(int)vertices[lVar17 + 1].y;
                iVar13 = iVar33 + 1;
                sx = (int)vertices[lVar17 + 1].x;
              }
            }
            uVar23 = bVar24 & 1 ^ 1;
            vertices[num_vertices].type = '\x01';
            vertices[num_vertices].x = (short)sx;
            vertices[num_vertices].y = (short)uVar20;
            vertices[num_vertices].cx = 0;
            vertices[num_vertices].cy = 0;
            iVar33 = (ushort)(*(ushort *)(puVar4 + (long)iVar19 * 2 + uVar14 + 10) << 8 |
                             *(ushort *)(puVar4 + (long)iVar19 * 2 + uVar14 + 10) >> 8) + 1;
            iVar19 = iVar19 + 1;
            iVar11 = 0;
            local_e8._0_8_ = uVar31;
            num_vertices = num_vertices + 1;
            iVar21 = cx;
          }
          else {
            sVar18 = (short)local_108;
            if ((bVar24 & 1) == 0) {
              local_108 = uVar30;
              if (iVar11 == 0) {
                iVar11 = 1;
              }
              else {
                vertices[num_vertices].type = '\x03';
                vertices[num_vertices].x = (short)((uint)(cx + iVar21) >> 1);
                vertices[num_vertices].y = (short)(uVar29 + cy >> 1);
                vertices[num_vertices].cx = (short)cx;
                vertices[num_vertices].cy = sVar18;
                iVar11 = 1;
                num_vertices = num_vertices + 1;
              }
            }
            else {
              psVar16 = vertices + num_vertices;
              if (iVar11 == 0) {
                psVar16->type = '\x02';
                psVar16->x = sVar25;
                psVar16->y = sVar3;
                psVar16->cx = 0;
                sVar18 = 0;
              }
              else {
                psVar16->type = '\x03';
                psVar16->x = sVar25;
                psVar16->y = sVar3;
                psVar16->cx = (short)cx;
              }
              psVar16->cy = sVar18;
              iVar11 = 0;
              num_vertices = num_vertices + 1;
              iVar21 = cx;
            }
          }
          iVar13 = iVar13 + 1;
          cx = iVar21;
        }
        uVar12 = stbtt__close_shape(vertices,num_vertices,iVar11,uVar23,sx,(stbtt_int32)uVar20,
                                    sVar22,local_e8._0_4_,cx,cy);
        uVar20 = (ulong)uVar12;
      }
      iVar10 = (int)uVar20;
      *pvertices = vertices;
    }
  }
  else {
    count_ctx.first_x = 0.0;
    count_ctx.first_y = 0.0;
    count_ctx.min_y = 0;
    count_ctx.max_y = 0;
    count_ctx.pvertices = (stbtt_vertex *)0x0;
    count_ctx.num_vertices = 0;
    count_ctx._52_4_ = 0;
    count_ctx.x = 0.0;
    count_ctx.y = 0.0;
    count_ctx.min_x = 0;
    count_ctx.max_x = 0;
    count_ctx.bounds = 1;
    count_ctx.started = 0;
    local_a8.min_y = 0;
    local_a8.max_y = 0;
    local_a8.pvertices = (stbtt_vertex *)0x0;
    local_a8.x = 0.0;
    local_a8.y = 0.0;
    local_a8.min_x = 0;
    local_a8.max_x = 0;
    local_a8.bounds = 0;
    local_a8.started = 0;
    local_a8.first_x = 0.0;
    local_a8.first_y = 0.0;
    local_a8.num_vertices = 0;
    local_a8._52_4_ = 0;
    iVar10 = stbtt__run_charstring(info,glyph_index,&count_ctx);
    if (iVar10 != 0) {
      iVar10 = count_ctx.num_vertices;
      local_a8.pvertices = (stbtt_vertex *)malloc((long)count_ctx.num_vertices * 0xe);
      *pvertices = local_a8.pvertices;
      iVar11 = stbtt__run_charstring(info,glyph_index,&local_a8);
      if (iVar11 != 0) {
        if (local_a8.num_vertices == iVar10) {
          return iVar10;
        }
        __assert_fail("output_ctx.num_vertices == count_ctx.num_vertices",
                      "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/stb_truetype.h"
                      ,0x8e6,
                      "int stbtt__GetGlyphShapeT2(const stbtt_fontinfo *, int, stbtt_vertex **)");
      }
    }
    *pvertices = (stbtt_vertex *)0x0;
LAB_00132695:
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   if (!info->cff.size)
      return stbtt__GetGlyphShapeTT(info, glyph_index, pvertices);
   else
      return stbtt__GetGlyphShapeT2(info, glyph_index, pvertices);
}